

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loc_comp_dpg.h
# Opt level: O0

void __thiscall
projects::dpg::
FluxElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpMinus,_lf::mesh::utils::MeshFunctionConstant<double>_>_>
::FluxElementMatrixProvider
          (FluxElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpMinus,_lf::mesh::utils::MeshFunctionConstant<double>_>_>
           *this,shared_ptr<projects::dpg::ProductUniformFESpace<double>_> *fe_space_trial,
          shared_ptr<projects::dpg::ProductUniformFESpace<double>_> *fe_space_test,
          size_type trial_component,size_type test_component,
          MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpMinus,_lf::mesh::utils::MeshFunctionConstant<double>_>
          alpha)

{
  ScalarReferenceFiniteElement<double> *fe;
  int iVar1;
  int iVar2;
  uint uVar3;
  element_type *peVar4;
  ScalarReferenceFiniteElement<double> *fe_00;
  reference this_00;
  size_type sVar5;
  ostream *poVar6;
  reference pvVar7;
  reference pvVar8;
  reference this_01;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  QuadRule local_998;
  PrecomputedScalarReferenceFiniteElement<double> local_968;
  int local_8f8;
  allocator<char> local_8f1;
  int segment;
  allocator<char> local_8c9;
  string local_8c8;
  allocator<char> local_8a1;
  string local_8a0;
  string local_880;
  allocator<char> local_859;
  string local_858;
  allocator<char> local_831;
  string local_830;
  stringstream local_810 [8];
  stringstream ss_2;
  ostream local_800 [376];
  size_type local_688;
  RefElType local_681;
  int numSegments;
  vector<lf::quad::QuadRule,_std::allocator<lf::quad::QuadRule>_> boundaryQr;
  PrecomputedScalarReferenceFiniteElement<double> local_638;
  RefElType local_5c1;
  undefined1 local_5c0 [8];
  QuadRule segment_qr;
  int degree;
  ScalarReferenceFiniteElement<double> *fe_test;
  const_iterator pRStack_578;
  RefEl ref_el;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<lf::base::RefEl> local_560;
  initializer_list<lf::base::RefEl> *local_550;
  initializer_list<lf::base::RefEl> *__range2;
  string local_540;
  allocator<char> local_519;
  string local_518;
  allocator<char> local_4f1;
  string local_4f0;
  string local_4d0;
  allocator<char> local_4a9;
  string local_4a8;
  allocator<char> local_481;
  string local_480;
  stringstream local_460 [8];
  stringstream ss_1;
  ostream local_450 [383];
  allocator<char> local_2d1;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  string local_260;
  allocator<char> local_239;
  string local_238;
  allocator<char> local_211;
  string local_210;
  stringstream local_1f0 [8];
  stringstream ss;
  ostream local_1e0 [383];
  RefElType local_61;
  ScalarReferenceFiniteElement<double> *local_60;
  ScalarReferenceFiniteElement<double> *fe_trial;
  size_type local_38;
  size_type local_34;
  size_type test_component_local;
  size_type trial_component_local;
  shared_ptr<projects::dpg::ProductUniformFESpace<double>_> *fe_space_test_local;
  shared_ptr<projects::dpg::ProductUniformFESpace<double>_> *fe_space_trial_local;
  FluxElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpMinus,_lf::mesh::utils::MeshFunctionConstant<double>_>_>
  *this_local;
  MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpMinus,_lf::mesh::utils::MeshFunctionConstant<double>_>
  alpha_local;
  
  alpha_local._4_4_ = in_XMM0_Db;
  alpha_local._0_4_ = in_XMM0_Da;
  local_38 = test_component;
  local_34 = trial_component;
  _test_component_local = (pointer)fe_space_test;
  fe_space_test_local = fe_space_trial;
  fe_space_trial_local = (shared_ptr<projects::dpg::ProductUniformFESpace<double>_> *)this;
  SubElementMatrixProvider<double>::SubElementMatrixProvider
            (&this->super_SubElementMatrixProvider<double>);
  (this->super_SubElementMatrixProvider<double>)._vptr_SubElementMatrixProvider =
       (_func_int **)&PTR__FluxElementMatrixProvider_008e6d30;
  *(FluxElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpMinus,_lf::mesh::utils::MeshFunctionConstant<double>_>_>
    **)&this->alpha_ = this_local;
  (this->alpha_).mf_.value_ = (double)alpha_local._0_8_;
  memset(&this->fe_precomp_trial_,0,0x230);
  std::array<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>,_5UL>::array
            (&this->fe_precomp_trial_);
  (this->fe_precomp_test_)._M_elems[4].
  super__Vector_base<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>,_std::allocator<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fe_precomp_test_)._M_elems[4].
  super__Vector_base<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>,_std::allocator<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->fe_precomp_test_)._M_elems[3].
  super__Vector_base<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>,_std::allocator<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->fe_precomp_test_)._M_elems[3].
  super__Vector_base<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>,_std::allocator<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->fe_precomp_test_)._M_elems[2].
  super__Vector_base<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>,_std::allocator<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->fe_precomp_test_)._M_elems[3].
  super__Vector_base<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>,_std::allocator<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fe_precomp_test_)._M_elems[2].
  super__Vector_base<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>,_std::allocator<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fe_precomp_test_)._M_elems[2].
  super__Vector_base<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>,_std::allocator<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->fe_precomp_test_)._M_elems[1].
  super__Vector_base<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>,_std::allocator<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->fe_precomp_test_)._M_elems[1].
  super__Vector_base<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>,_std::allocator<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->fe_precomp_test_)._M_elems[0].
  super__Vector_base<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>,_std::allocator<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->fe_precomp_test_)._M_elems[1].
  super__Vector_base<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>,_std::allocator<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fe_precomp_test_)._M_elems[0].
  super__Vector_base<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>,_std::allocator<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fe_precomp_test_)._M_elems[0].
  super__Vector_base<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>,_std::allocator<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->fe_precomp_test_)._M_elems[4].
  super__Vector_base<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>,_std::allocator<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  array<std::vector<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>,_std::allocator<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>_>_>,_5UL>
  ::array(&this->fe_precomp_test_);
  this->trial_component_ = local_34;
  this->test_component_ = local_38;
  std::
  __shared_ptr_access<projects::dpg::ProductUniformFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<projects::dpg::ProductUniformFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)fe_space_trial);
  ProductUniformFESpace<double>::Mesh((ProductUniformFESpace<double> *)&fe_trial);
  PrescribedSignProvider::PrescribedSignProvider
            (&this->sign_provider_,(shared_ptr<const_lf::mesh::Mesh> *)&fe_trial);
  std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr((shared_ptr<const_lf::mesh::Mesh> *)&fe_trial);
  peVar4 = std::
           __shared_ptr_access<projects::dpg::ProductUniformFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<projects::dpg::ProductUniformFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)fe_space_trial);
  local_61 = (RefElType)lf::base::RefEl::kSegment();
  local_60 = ProductUniformFESpace<double>::ShapeFunctionLayout
                       (peVar4,(RefEl)local_61,this->trial_component_);
  if (local_60 == (ScalarReferenceFiniteElement<double> *)0x0) {
    std::__cxx11::stringstream::stringstream(local_1f0);
    std::operator<<(local_1e0,"Missing description of flux space");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,"fe_trial != nullptr",&local_211);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
               ,&local_239);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_210,&local_238,0x385,&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator(&local_239);
    std::__cxx11::string::~string((string *)&local_210);
    std::allocator<char>::~allocator(&local_211);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"false",&local_281);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
               ,&local_2a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"",&local_2d1);
    lf::base::AssertionFailed(&local_280,&local_2a8,0x385,&local_2d0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::allocator<char>::~allocator(&local_2d1);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator(&local_2a9);
    std::__cxx11::string::~string((string *)&local_280);
    std::allocator<char>::~allocator(&local_281);
    abort();
  }
  iVar1 = (*local_60->_vptr_ScalarReferenceFiniteElement[5])(local_60,1);
  if (iVar1 != 0) {
    std::__cxx11::stringstream::stringstream(local_460);
    std::operator<<(local_450,"shape functions associated with endpoints not supported.");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_480,"fe_trial->NumRefShapeFunctions(1) == 0",&local_481);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4a8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
               ,&local_4a9);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_480,&local_4a8,0x387,&local_4d0);
    std::__cxx11::string::~string((string *)&local_4d0);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::allocator<char>::~allocator(&local_4a9);
    std::__cxx11::string::~string((string *)&local_480);
    std::allocator<char>::~allocator(&local_481);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f0,"false",&local_4f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_518,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
               ,&local_519);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_540,"",(allocator<char> *)((long)&__range2 + 7));
    lf::base::AssertionFailed(&local_4f0,&local_518,0x387,&local_540);
    std::__cxx11::string::~string((string *)&local_540);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
    std::__cxx11::string::~string((string *)&local_518);
    std::allocator<char>::~allocator(&local_519);
    std::__cxx11::string::~string((string *)&local_4f0);
    std::allocator<char>::~allocator(&local_4f1);
    abort();
  }
  __begin2._6_1_ = lf::base::RefEl::kTria();
  __begin2._7_1_ = lf::base::RefEl::kQuad();
  local_560._M_array = (iterator)((long)&__begin2 + 6);
  local_560._M_len = 2;
  local_550 = &local_560;
  __end2 = std::initializer_list<lf::base::RefEl>::begin(local_550);
  pRStack_578 = std::initializer_list<lf::base::RefEl>::end(local_550);
  do {
    if (__end2 == pRStack_578) {
      return;
    }
    fe_test._7_1_ = (RefEl)__end2->type_;
    peVar4 = std::
             __shared_ptr_access<projects::dpg::ProductUniformFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<projects::dpg::ProductUniformFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)fe_space_test);
    segment_qr.weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_rows._7_1_ = fe_test._7_1_;
    fe_00 = ProductUniformFESpace<double>::ShapeFunctionLayout
                      (peVar4,fe_test._7_1_,this->test_component_);
    if (fe_00 != (ScalarReferenceFiniteElement<double> *)0x0) {
      iVar1 = (*local_60->_vptr_ScalarReferenceFiniteElement[3])();
      iVar2 = (*fe_00->_vptr_ScalarReferenceFiniteElement[3])();
      segment_qr.weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_rows._0_4_ = iVar1 + iVar2;
      local_5c1 = (RefElType)lf::base::RefEl::kSegment();
      lf::quad::make_QuadRule
                ((QuadRule *)local_5c0,(RefEl)local_5c1,
                 (uint)segment_qr.weights_.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows);
      fe = local_60;
      lf::quad::QuadRule::QuadRule
                ((QuadRule *)
                 &boundaryQr.
                  super__Vector_base<lf::quad::QuadRule,_std::allocator<lf::quad::QuadRule>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(QuadRule *)local_5c0);
      lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::
      PrecomputedScalarReferenceFiniteElement
                (&local_638,fe,
                 (QuadRule *)
                 &boundaryQr.
                  super__Vector_base<lf::quad::QuadRule,_std::allocator<lf::quad::QuadRule>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      uVar3 = lf::base::RefEl::Id((RefEl *)((long)&fe_test + 7));
      this_00 = std::array<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>,_5UL>::
                operator[](&this->fe_precomp_trial_,(ulong)uVar3);
      lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::operator=(this_00,&local_638);
      lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::
      ~PrecomputedScalarReferenceFiniteElement(&local_638);
      lf::quad::QuadRule::~QuadRule
                ((QuadRule *)
                 &boundaryQr.
                  super__Vector_base<lf::quad::QuadRule,_std::allocator<lf::quad::QuadRule>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      local_681 = fe_test._7_1_;
      BoundaryQuadRule((vector<lf::quad::QuadRule,_std::allocator<lf::quad::QuadRule>_> *)
                       &numSegments,fe_test._7_1_,(QuadRule *)local_5c0);
      local_688 = lf::base::RefEl::NumSubEntities((RefEl *)((long)&fe_test + 7),1);
      sVar5 = std::vector<lf::quad::QuadRule,_std::allocator<lf::quad::QuadRule>_>::size
                        ((vector<lf::quad::QuadRule,_std::allocator<lf::quad::QuadRule>_> *)
                         &numSegments);
      if (sVar5 != (long)(int)local_688) {
        std::__cxx11::stringstream::stringstream(local_810);
        poVar6 = std::operator<<(local_800,"boundaryQr.size() = ");
        sVar5 = std::vector<lf::quad::QuadRule,_std::allocator<lf::quad::QuadRule>_>::size
                          ((vector<lf::quad::QuadRule,_std::allocator<lf::quad::QuadRule>_> *)
                           &numSegments);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar5);
        poVar6 = std::operator<<(poVar6," <-> ");
        poVar6 = std::operator<<(poVar6,"numSegments= ");
        std::ostream::operator<<(poVar6,local_688);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_830,"boundaryQr.size() == numSegments",&local_831);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_858,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
                   ,&local_859);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed(&local_830,&local_858,0x3a3,&local_880);
        std::__cxx11::string::~string((string *)&local_880);
        std::__cxx11::string::~string((string *)&local_858);
        std::allocator<char>::~allocator(&local_859);
        std::__cxx11::string::~string((string *)&local_830);
        std::allocator<char>::~allocator(&local_831);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_8a0,"false",&local_8a1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_8c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
                   ,&local_8c9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&segment,"",&local_8f1);
        lf::base::AssertionFailed(&local_8a0,&local_8c8,0x3a3,(string *)&segment);
        std::__cxx11::string::~string((string *)&segment);
        std::allocator<char>::~allocator(&local_8f1);
        std::__cxx11::string::~string((string *)&local_8c8);
        std::allocator<char>::~allocator(&local_8c9);
        std::__cxx11::string::~string((string *)&local_8a0);
        std::allocator<char>::~allocator(&local_8a1);
        abort();
      }
      uVar3 = lf::base::RefEl::Id((RefEl *)((long)&fe_test + 7));
      pvVar7 = std::
               array<std::vector<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>,_std::allocator<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>_>_>,_5UL>
               ::operator[](&this->fe_precomp_test_,(ulong)uVar3);
      std::
      vector<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>,_std::allocator<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>_>_>
      ::resize(pvVar7,(long)(int)local_688);
      for (local_8f8 = 0; local_8f8 < (int)local_688; local_8f8 = local_8f8 + 1) {
        pvVar8 = std::vector<lf::quad::QuadRule,_std::allocator<lf::quad::QuadRule>_>::operator[]
                           ((vector<lf::quad::QuadRule,_std::allocator<lf::quad::QuadRule>_> *)
                            &numSegments,(long)local_8f8);
        lf::quad::QuadRule::QuadRule(&local_998,pvVar8);
        lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::
        PrecomputedScalarReferenceFiniteElement(&local_968,fe_00,&local_998);
        uVar3 = lf::base::RefEl::Id((RefEl *)((long)&fe_test + 7));
        pvVar7 = std::
                 array<std::vector<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>,_std::allocator<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>_>_>,_5UL>
                 ::operator[](&this->fe_precomp_test_,(ulong)uVar3);
        this_01 = std::
                  vector<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>,_std::allocator<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>_>_>
                  ::operator[](pvVar7,(long)local_8f8);
        lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::operator=(this_01,&local_968);
        lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::
        ~PrecomputedScalarReferenceFiniteElement(&local_968);
        lf::quad::QuadRule::~QuadRule(&local_998);
      }
      std::vector<lf::quad::QuadRule,_std::allocator<lf::quad::QuadRule>_>::~vector
                ((vector<lf::quad::QuadRule,_std::allocator<lf::quad::QuadRule>_> *)&numSegments);
      lf::quad::QuadRule::~QuadRule((QuadRule *)local_5c0);
    }
    __end2 = __end2 + 1;
  } while( true );
}

Assistant:

FluxElementMatrixProvider<SCALAR, DIFF_COEFF>::FluxElementMatrixProvider(
    std::shared_ptr<ProductUniformFESpace<SCALAR>> fe_space_trial,
    std::shared_ptr<ProductUniformFESpace<SCALAR>> fe_space_test,
    size_type trial_component, size_type test_component, DIFF_COEFF alpha)
    : alpha_(std::move(alpha)),
      trial_component_(trial_component),
      test_component_(test_component),
      sign_provider_(fe_space_trial->Mesh()),
      fe_precomp_test_(),
      fe_precomp_trial_() {
  // obtain description of the shape functions representing the flux.
  auto fe_trial = fe_space_trial->ShapeFunctionLayout(
      lf::base::RefEl::kSegment(), trial_component_);
  LF_ASSERT_MSG(fe_trial != nullptr, "Missing description of flux space");
  LF_ASSERT_MSG(fe_trial->NumRefShapeFunctions(1) == 0,
                "shape functions associated with endpoints not supported.");
  for (auto ref_el : {lf::base::RefEl::kTria(), lf::base::RefEl::kQuad()}) {
    // obtain description of the local shape functions in the test space.
    auto fe_test = fe_space_test->ShapeFunctionLayout(ref_el, test_component_);

    // check, that  shape functions of test space component for
    // that entity are available.
    // Note that the corresponding PrecomputedScalarReferenceFiniteElement local
    // object is not initialized if the associated description of local shape
    // functions is missing.
    if (fe_test != nullptr) {
      // use a quadrature rule whose degree is the sum of the degrees of the fe
      // spaces.
      int degree = fe_trial->Degree() + fe_test->Degree();
      lf::quad::QuadRule segment_qr =
          lf::quad::make_QuadRule(lf::base::RefEl::kSegment(), degree);

      // precompute cell-independent quantities for the flux
      fe_precomp_trial_[ref_el.Id()] =
          lf::uscalfe::PrecomputedScalarReferenceFiniteElement(fe_trial,
                                                               segment_qr);

      // transform quadrule to all parts of the boundary.
      std::vector<lf::quad::QuadRule> boundaryQr =
          BoundaryQuadRule(ref_el, segment_qr);
      int numSegments = ref_el.NumSubEntities(1);
      LF_ASSERT_MSG(boundaryQr.size() == numSegments,
                    "boundaryQr.size() = " << boundaryQr.size() << " <-> "
                                           << "numSegments= " << numSegments);
      fe_precomp_test_[ref_el.Id()].resize(numSegments);

      for (int segment = 0; segment < numSegments; segment++) {
        // On each edge of the boundary, compute cell-independent quantities for
        // the test soace,
        fe_precomp_test_[ref_el.Id()][segment] =
            lf::uscalfe::PrecomputedScalarReferenceFiniteElement(
                fe_test, boundaryQr[segment]);
      }
    }
  }
}